

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugServerConsole.cxx
# Opt level: O1

void __thiscall
cmDebugServerConsole::ProcessRequest
          (cmDebugServerConsole *this,cmConnection *connection,string *request)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmDebugger *pcVar2;
  size_type sVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long *plVar8;
  ostream *poVar9;
  cmMakefile *this_00;
  char *__s;
  undefined8 *puVar10;
  size_t sVar11;
  size_type *psVar12;
  size_t lineCount;
  WatchpointType type;
  ulong uVar13;
  undefined8 uVar14;
  _Alloc_hider _Var15;
  ulong uVar16;
  vector<cmBreakpoint,_std::allocator<cmBreakpoint>_> bps;
  vector<cmWatchpoint,_std::allocator<cmWatchpoint>_> wps;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bpSpecifier_1;
  cmPauseContext ctx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bpSpecifier;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  cmListFileContext local_2b0;
  string *local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  cmPauseContext local_220;
  cmDebugServerConsole *local_208;
  undefined1 local_200 [32];
  string local_1e0 [3];
  ios_base local_180 [264];
  cmConnection *local_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar5 = std::__cxx11::string::compare((char *)request);
  if (iVar5 == 0) {
    (*((this->super_cmDebugServer).super_cmDebuggerListener.Debugger)->_vptr_cmDebugger[0x15])();
    goto LAB_00479802;
  }
  iVar5 = std::__cxx11::string::compare((char *)request);
  if (iVar5 == 0) {
    exit(0);
  }
  lVar7 = std::__cxx11::string::find((char *)request,0x591f58,0);
  if (lVar7 == 0) {
    std::__cxx11::string::substr((ulong)local_200,(ulong)request);
    pcVar2 = (this->super_cmDebugServer).super_cmDebuggerListener.Debugger;
    (*pcVar2->_vptr_cmDebugger[0x12])(pcVar2,local_200,0xb);
    std::operator+(&local_2f0,"Set watchpoint on write \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200);
    puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
    local_2b0.Name._M_dataplus._M_p = (pointer)&local_2b0.Name.field_2;
    psVar12 = puVar10 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_2b0.Name.field_2._M_allocated_capacity = *psVar12;
      local_2b0.Name.field_2._8_8_ = puVar10[3];
    }
    else {
      local_2b0.Name.field_2._M_allocated_capacity = *psVar12;
      local_2b0.Name._M_dataplus._M_p = (pointer)*puVar10;
    }
    local_2b0.Name._M_string_length = puVar10[1];
    *puVar10 = psVar12;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    (**connection->_vptr_cmConnection)(connection);
LAB_004797ac:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0.Name._M_dataplus._M_p != &local_2b0.Name.field_2) {
      operator_delete(local_2b0.Name._M_dataplus._M_p,
                      local_2b0.Name.field_2._M_allocated_capacity + 1);
    }
    uVar14 = local_2f0.field_2._M_allocated_capacity;
    _Var15._M_p = local_2f0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
LAB_004797d9:
      operator_delete(_Var15._M_p,uVar14 + 1);
    }
LAB_004797e1:
    uVar14 = local_200._16_8_;
    _Var15._M_p = (pointer)local_200._0_8_;
    if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
LAB_004797fa:
      operator_delete(_Var15._M_p,uVar14 + 1);
    }
  }
  else {
    lVar7 = std::__cxx11::string::find((char *)request,0x591f36,0);
    if (lVar7 == 0) {
      std::__cxx11::string::substr((ulong)local_200,(ulong)request);
      pcVar2 = (this->super_cmDebugServer).super_cmDebuggerListener.Debugger;
      (*pcVar2->_vptr_cmDebugger[0x12])(pcVar2,local_200,4);
      std::operator+(&local_2f0,"Set watchpoint on read \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200)
      ;
      puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
      local_2b0.Name._M_dataplus._M_p = (pointer)&local_2b0.Name.field_2;
      psVar12 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_2b0.Name.field_2._M_allocated_capacity = *psVar12;
        local_2b0.Name.field_2._8_8_ = puVar10[3];
      }
      else {
        local_2b0.Name.field_2._M_allocated_capacity = *psVar12;
        local_2b0.Name._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_2b0.Name._M_string_length = puVar10[1];
      *puVar10 = psVar12;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      (**connection->_vptr_cmConnection)(connection);
      goto LAB_004797ac;
    }
    lVar7 = std::__cxx11::string::find((char *)request,0x591f57,0);
    if (lVar7 == 0) {
      std::__cxx11::string::substr((ulong)local_200,(ulong)request);
      pcVar2 = (this->super_cmDebugServer).super_cmDebuggerListener.Debugger;
      (*pcVar2->_vptr_cmDebugger[0x12])(pcVar2,local_200,0xf);
      std::operator+(&local_2f0,"Set watchpoint on read/write \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200)
      ;
      puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
      local_2b0.Name._M_dataplus._M_p = (pointer)&local_2b0.Name.field_2;
      psVar12 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_2b0.Name.field_2._M_allocated_capacity = *psVar12;
        local_2b0.Name.field_2._8_8_ = puVar10[3];
      }
      else {
        local_2b0.Name.field_2._M_allocated_capacity = *psVar12;
        local_2b0.Name._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_2b0.Name._M_string_length = puVar10[1];
      *puVar10 = psVar12;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      (**connection->_vptr_cmConnection)(connection);
      goto LAB_004797ac;
    }
    lVar7 = std::__cxx11::string::find((char *)request,0x591f7e,0);
    if (lVar7 == 0) {
      local_268 = request;
      local_78 = connection;
      std::__cxx11::stringstream::stringstream((stringstream *)local_200);
      local_208 = this;
      (*((this->super_cmDebugServer).super_cmDebuggerListener.Debugger)->_vptr_cmDebugger[7])
                (&local_2f0);
      if ((pointer)local_2f0._M_string_length != local_2f0._M_dataplus._M_p) {
        uVar13 = 0;
        uVar16 = 1;
        do {
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)(local_200 + 0x10));
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," \tbreakpoint \t",0xe);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,*(char **)(local_2f0._M_dataplus._M_p + uVar13 * 0x30 + 8),
                              *(long *)(local_2f0._M_dataplus._M_p + uVar13 * 0x30 + 0x10));
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,":",1);
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
          std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
          uVar13 = ((long)(local_2f0._M_string_length - (long)local_2f0._M_dataplus._M_p) >> 4) *
                   -0x5555555555555555;
          bVar4 = uVar16 <= uVar13;
          lVar7 = uVar13 - uVar16;
          uVar13 = uVar16;
          uVar16 = (ulong)((int)uVar16 + 1);
        } while (bVar4 && lVar7 != 0);
      }
      (*((local_208->super_cmDebugServer).super_cmDebuggerListener.Debugger)->_vptr_cmDebugger[8])
                (&local_2d0);
      if ((pointer)local_2d0._M_string_length != local_2d0._M_dataplus._M_p) {
        uVar13 = 0;
        uVar16 = 1;
        do {
          lVar7 = uVar13 * 0x30;
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)(local_200 + 0x10));
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," \twatchpoint \t",0xe);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,*(char **)(local_2d0._M_dataplus._M_p + lVar7 + 0x10),
                              *(long *)(local_2d0._M_dataplus._M_p + lVar7 + 0x18));
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," \t(",3);
          cmWatchpoint::GetTypeAsString_abi_cxx11_
                    (&local_2b0.Name,
                     (cmWatchpoint *)(ulong)*(uint *)(local_2d0._M_dataplus._M_p + lVar7 + 8),type);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,local_2b0.Name._M_dataplus._M_p,local_2b0.Name._M_string_length
                             );
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,")",1);
          std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0.Name._M_dataplus._M_p != &local_2b0.Name.field_2) {
            operator_delete(local_2b0.Name._M_dataplus._M_p,
                            local_2b0.Name.field_2._M_allocated_capacity + 1);
          }
          uVar13 = ((long)(local_2d0._M_string_length - (long)local_2d0._M_dataplus._M_p) >> 4) *
                   -0x5555555555555555;
          bVar4 = uVar16 <= uVar13;
          lVar7 = uVar13 - uVar16;
          uVar13 = uVar16;
          uVar16 = (ulong)((int)uVar16 + 1);
        } while (bVar4 && lVar7 != 0);
      }
      std::__cxx11::stringbuf::str();
      connection = local_78;
      request = local_268;
      (**local_78->_vptr_cmConnection)(local_78,&local_2b0);
      this = local_208;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0.Name._M_dataplus._M_p != &local_2b0.Name.field_2) {
        operator_delete(local_2b0.Name._M_dataplus._M_p,
                        local_2b0.Name.field_2._M_allocated_capacity + 1);
      }
      std::vector<cmWatchpoint,_std::allocator<cmWatchpoint>_>::~vector
                ((vector<cmWatchpoint,_std::allocator<cmWatchpoint>_> *)&local_2d0);
      std::vector<cmBreakpoint,_std::allocator<cmBreakpoint>_>::~vector
                ((vector<cmBreakpoint,_std::allocator<cmBreakpoint>_> *)&local_2f0);
      std::__cxx11::stringstream::~stringstream((stringstream *)local_200);
      std::ios_base::~ios_base(local_180);
      goto LAB_00479802;
    }
    lVar7 = std::__cxx11::string::find((char *)request,0x591fa8,0);
    if (lVar7 != 0) {
      lVar7 = std::__cxx11::string::find((char *)request,0x591f83,0);
      if ((lVar7 != 0) || (lVar7 = std::__cxx11::string::find((char)request,0x20), lVar7 == -1))
      goto LAB_00479802;
      std::__cxx11::string::substr((ulong)local_200,(ulong)request);
      lVar7 = std::__cxx11::string::rfind('\0',0x3a);
      if (lVar7 != -1) {
        std::__cxx11::string::substr((ulong)&local_2b0,(ulong)local_200);
        local_268 = request;
        iVar5 = std::__cxx11::stoi(&local_2b0.Name,(size_t *)0x0,10);
        paVar1 = &local_2b0.Name.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0.Name._M_dataplus._M_p != paVar1) {
          operator_delete(local_2b0.Name._M_dataplus._M_p,
                          local_2b0.Name.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::substr((ulong)&local_2b0,(ulong)local_200);
        std::__cxx11::string::operator=((string *)local_200,(string *)&local_2b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0.Name._M_dataplus._M_p != paVar1) {
          operator_delete(local_2b0.Name._M_dataplus._M_p,
                          local_2b0.Name.field_2._M_allocated_capacity + 1);
        }
        pcVar2 = (this->super_cmDebugServer).super_cmDebuggerListener.Debugger;
        (*pcVar2->_vptr_cmDebugger[0xe])(pcVar2,local_200,(long)iVar5);
        std::operator+(&local_240,"Break at ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_200);
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_240);
        psVar12 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_2d0.field_2._M_allocated_capacity = *psVar12;
          local_2d0.field_2._8_8_ = plVar8[3];
          local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
        }
        else {
          local_2d0.field_2._M_allocated_capacity = *psVar12;
          local_2d0._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_2d0._M_string_length = plVar8[1];
        *plVar8 = (long)psVar12;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        std::__cxx11::to_string(&local_260,(long)iVar5);
        std::operator+(&local_2f0,&local_2d0,&local_260);
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
        psVar12 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_2b0.Name.field_2._M_allocated_capacity = *psVar12;
          local_2b0.Name.field_2._8_8_ = puVar10[3];
          local_2b0.Name._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_2b0.Name.field_2._M_allocated_capacity = *psVar12;
          local_2b0.Name._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_2b0.Name._M_string_length = puVar10[1];
        *puVar10 = psVar12;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        (**connection->_vptr_cmConnection)(connection);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0.Name._M_dataplus._M_p != paVar1) {
          operator_delete(local_2b0.Name._M_dataplus._M_p,
                          local_2b0.Name.field_2._M_allocated_capacity + 1);
        }
        request = local_268;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
          operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_dataplus._M_p != &local_260.field_2) {
          operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
          operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
        }
        uVar14 = local_240.field_2._M_allocated_capacity;
        _Var15._M_p = local_240._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_dataplus._M_p == &local_240.field_2) goto LAB_004797e1;
        goto LAB_004797d9;
      }
      goto LAB_004797e1;
    }
    lVar7 = std::__cxx11::string::find((char)request,0x20);
    if (lVar7 != -1) {
      local_268 = request;
      std::__cxx11::string::substr((ulong)local_200,(ulong)request);
      iVar5 = std::__cxx11::stoi((string *)local_200,(size_t *)0x0,10);
      paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_200 + 0x10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._0_8_ != paVar1) {
        operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
      }
      pcVar2 = (this->super_cmDebugServer).super_cmDebuggerListener.Debugger;
      iVar6 = (*pcVar2->_vptr_cmDebugger[0xf])(pcVar2,(long)iVar5);
      local_200._0_8_ = paVar1;
      if ((char)iVar6 == '\0') {
        pcVar2 = (this->super_cmDebugServer).super_cmDebuggerListener.Debugger;
        iVar6 = (*pcVar2->_vptr_cmDebugger[0x13])(pcVar2,(long)iVar5);
        if ((char)iVar6 == '\0') {
          std::__cxx11::to_string(&local_2f0,iVar5);
          std::operator+(&local_2b0.Name,"Could not find breakpoint or watchpoint with ID of ",
                         &local_2f0);
          puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b0);
          psVar12 = puVar10 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_200._16_8_ = *psVar12;
            local_200._24_4_ = *(undefined4 *)(puVar10 + 3);
            local_200._28_4_ = *(undefined4 *)((long)puVar10 + 0x1c);
          }
          else {
            local_200._16_8_ = *psVar12;
            local_200._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar10;
          }
          local_200._8_8_ = puVar10[1];
          *puVar10 = psVar12;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          (**connection->_vptr_cmConnection)(connection);
        }
        else {
          std::__cxx11::to_string(&local_2f0,iVar5);
          std::operator+(&local_2b0.Name,"Cleared watchpoint ",&local_2f0);
          puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b0);
          psVar12 = puVar10 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_200._16_8_ = *psVar12;
            local_200._24_4_ = *(undefined4 *)(puVar10 + 3);
            local_200._28_4_ = *(undefined4 *)((long)puVar10 + 0x1c);
          }
          else {
            local_200._16_8_ = *psVar12;
            local_200._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar10;
          }
          local_200._8_8_ = puVar10[1];
          *puVar10 = psVar12;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          (**connection->_vptr_cmConnection)(connection);
        }
      }
      else {
        std::__cxx11::to_string(&local_2f0,iVar5);
        std::operator+(&local_2b0.Name,"Cleared breakpoint ",&local_2f0);
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b0);
        psVar12 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_200._16_8_ = *psVar12;
          local_200._24_4_ = *(undefined4 *)(puVar10 + 3);
          local_200._28_4_ = *(undefined4 *)((long)puVar10 + 0x1c);
        }
        else {
          local_200._16_8_ = *psVar12;
          local_200._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar10;
        }
        local_200._8_8_ = puVar10[1];
        *puVar10 = psVar12;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        (**connection->_vptr_cmConnection)(connection);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._0_8_ != paVar1) {
        operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
      }
      request = local_268;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0.Name._M_dataplus._M_p != &local_2b0.Name.field_2) {
        operator_delete(local_2b0.Name._M_dataplus._M_p,
                        local_2b0.Name.field_2._M_allocated_capacity + 1);
      }
      uVar14 = local_2f0.field_2._M_allocated_capacity;
      _Var15._M_p = local_2f0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p == &local_2f0.field_2) goto LAB_00479802;
      goto LAB_004797fa;
    }
    (*((this->super_cmDebugServer).super_cmDebuggerListener.Debugger)->_vptr_cmDebugger[0x11])();
    (*((this->super_cmDebugServer).super_cmDebuggerListener.Debugger)->_vptr_cmDebugger[0x14])();
    local_200._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_200 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_200,"Cleared all breakpoints and watchpoints\n","");
    (**connection->_vptr_cmConnection)(connection,local_200);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_200 + 0x10)) {
      operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
    }
  }
LAB_00479802:
  (*((this->super_cmDebugServer).super_cmDebuggerListener.Debugger)->_vptr_cmDebugger[0x17])
            (&local_220);
  bVar4 = cmPauseContext::operator_cast_to_bool(&local_220);
  if (!bVar4) goto LAB_0047a5d6;
  lVar7 = std::__cxx11::string::find((char *)request,0x59203d,0);
  if (lVar7 == 0) {
    cmPauseContext::StepOut(&local_220);
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)request);
    if (iVar5 == 0) {
      cmPauseContext::Continue(&local_220);
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)request);
      if (iVar5 == 0) {
        cmPauseContext::Step(&local_220);
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)request);
        if (iVar5 == 0) {
          cmPauseContext::StepIn(&local_220);
        }
        else {
          lineCount = 1;
          lVar7 = std::__cxx11::string::find((char *)request,0x57f606,0);
          if (lVar7 == 0) {
            cmPauseContext::CurrentLine((cmListFileContext *)local_200,&local_220);
            cmPauseContext::CurrentLine(&local_2b0,&local_220);
            getFileLines(&local_2f0,local_1e0,local_2b0.Line,lineCount);
            cmListFileContext::~cmListFileContext(&local_2b0);
            cmListFileContext::~cmListFileContext((cmListFileContext *)local_200);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_200,&local_2f0,"\n");
            (**connection->_vptr_cmConnection)(connection,local_200);
            if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
              operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
LAB_0047a59e:
              operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1
                             );
            }
          }
          else {
            lVar7 = std::__cxx11::string::find((char *)request,0x594b2b,0);
            if (lVar7 == 0) {
              sVar3 = request->_M_string_length;
              if (sVar3 == 4) {
                local_2b0.Name._M_dataplus._M_p = (pointer)&local_2b0.Name.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"");
              }
              else {
                std::__cxx11::string::substr((ulong)&local_2f0,(ulong)request);
                puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
                local_2b0.Name._M_dataplus._M_p = (pointer)&local_2b0.Name.field_2;
                psVar12 = puVar10 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar10 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar12) {
                  local_2b0.Name.field_2._M_allocated_capacity = *psVar12;
                  local_2b0.Name.field_2._8_8_ = puVar10[3];
                }
                else {
                  local_2b0.Name.field_2._M_allocated_capacity = *psVar12;
                  local_2b0.Name._M_dataplus._M_p = (pointer)*puVar10;
                }
                local_2b0.Name._M_string_length = puVar10[1];
                *puVar10 = psVar12;
                puVar10[1] = 0;
                *(undefined1 *)(puVar10 + 2) = 0;
              }
              if ((sVar3 != 4) &&
                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2f0._M_dataplus._M_p != &local_2f0.field_2)) {
                operator_delete(local_2f0._M_dataplus._M_p,
                                local_2f0.field_2._M_allocated_capacity + 1);
              }
              cmPauseContext::CurrentLine((cmListFileContext *)local_200,&local_220);
              std::operator+(&local_2d0,&local_2b0.Name,local_1e0);
              system(local_2d0._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
                operator_delete(local_2d0._M_dataplus._M_p,
                                local_2d0.field_2._M_allocated_capacity + 1);
              }
              cmListFileContext::~cmListFileContext((cmListFileContext *)local_200);
LAB_0047a1da:
              local_2f0.field_2._M_allocated_capacity = local_2b0.Name.field_2._M_allocated_capacity
              ;
              local_2f0._M_dataplus._M_p = local_2b0.Name._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b0.Name._M_dataplus._M_p != &local_2b0.Name.field_2) goto LAB_0047a59e;
            }
            else {
              iVar5 = std::__cxx11::string::compare((char *)request);
              if (iVar5 == 0) {
                cmPauseContext::CurrentLine(&local_2b0,&local_220);
                std::operator+(&local_50,"Paused at ",&local_2b0.FilePath);
                plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
                psVar12 = (size_type *)(plVar8 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar8 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar12) {
                  local_260.field_2._M_allocated_capacity = *psVar12;
                  local_260.field_2._8_8_ = plVar8[3];
                  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
                }
                else {
                  local_260.field_2._M_allocated_capacity = *psVar12;
                  local_260._M_dataplus._M_p = (pointer)*plVar8;
                }
                local_260._M_string_length = plVar8[1];
                *plVar8 = (long)psVar12;
                plVar8[1] = 0;
                *(undefined1 *)(plVar8 + 2) = 0;
                std::__cxx11::to_string(&local_70,local_2b0.Line);
                std::operator+(&local_240,&local_260,&local_70);
                plVar8 = (long *)std::__cxx11::string::append((char *)&local_240);
                paVar1 = &local_2d0.field_2;
                psVar12 = (size_type *)(plVar8 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar8 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar12) {
                  local_2d0.field_2._M_allocated_capacity = *psVar12;
                  local_2d0.field_2._8_8_ = plVar8[3];
                  local_2d0._M_dataplus._M_p = (pointer)paVar1;
                }
                else {
                  local_2d0.field_2._M_allocated_capacity = *psVar12;
                  local_2d0._M_dataplus._M_p = (pointer)*plVar8;
                }
                local_2d0._M_string_length = plVar8[1];
                *plVar8 = (long)psVar12;
                plVar8[1] = 0;
                *(undefined1 *)(plVar8 + 2) = 0;
                std::operator+(&local_2f0,&local_2d0,&local_2b0.Name);
                puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
                psVar12 = puVar10 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar10 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar12) {
                  local_200._16_8_ = *psVar12;
                  local_200._24_4_ = *(undefined4 *)(puVar10 + 3);
                  local_200._28_4_ = *(undefined4 *)((long)puVar10 + 0x1c);
                  local_200._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(local_200 + 0x10);
                }
                else {
                  local_200._16_8_ = *psVar12;
                  local_200._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)*puVar10;
                }
                local_200._8_8_ = puVar10[1];
                *puVar10 = psVar12;
                puVar10[1] = 0;
                *(undefined1 *)(puVar10 + 2) = 0;
                (**connection->_vptr_cmConnection)(connection);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_200._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_200 + 0x10)) {
                  operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
                  operator_delete(local_2f0._M_dataplus._M_p,
                                  local_2f0.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2d0._M_dataplus._M_p != paVar1) {
                  operator_delete(local_2d0._M_dataplus._M_p,
                                  local_2d0.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_240._M_dataplus._M_p != &local_240.field_2) {
                  operator_delete(local_240._M_dataplus._M_p,
                                  local_240.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_70._M_dataplus._M_p != &local_70.field_2) {
                  operator_delete(local_70._M_dataplus._M_p,
                                  local_70.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_260._M_dataplus._M_p != &local_260.field_2) {
                  operator_delete(local_260._M_dataplus._M_p,
                                  local_260.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_50._M_dataplus._M_p != &local_50.field_2) {
                  operator_delete(local_50._M_dataplus._M_p,
                                  local_50.field_2._M_allocated_capacity + 1);
                }
                cmPauseContext::GetBacktrace((cmListFileBacktrace *)&local_2f0,&local_220);
                std::__cxx11::stringstream::stringstream((stringstream *)local_200);
                cmListFileBacktrace::PrintCallStack
                          ((cmListFileBacktrace *)&local_2f0,(ostream *)(local_200 + 0x10));
                std::__cxx11::stringbuf::str();
                (**connection->_vptr_cmConnection)(connection,&local_2d0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2d0._M_dataplus._M_p != paVar1) {
                  operator_delete(local_2d0._M_dataplus._M_p,
                                  local_2d0.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::stringstream::~stringstream((stringstream *)local_200);
                std::ios_base::~ios_base(local_180);
                cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&local_2f0);
                cmListFileContext::~cmListFileContext(&local_2b0);
              }
              else {
                lVar7 = std::__cxx11::string::find((char *)request,0x59204c,0);
                if (lVar7 == 0) {
                  std::__cxx11::string::substr((ulong)local_200,(ulong)request);
                  this_00 = cmPauseContext::GetMakefile(&local_220);
                  __s = cmMakefile::GetDefinition(this_00,(string *)local_200);
                  if (__s == (char *)0x0) {
                    std::operator+(&local_2b0.Name,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_200," isn\'t set.\n");
                    (**connection->_vptr_cmConnection)(connection,&local_2b0);
                    local_240.field_2._M_allocated_capacity =
                         local_2b0.Name.field_2._M_allocated_capacity;
                    local_240._M_dataplus._M_p = local_2b0.Name._M_dataplus._M_p;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2b0.Name._M_dataplus._M_p != &local_2b0.Name.field_2)
                    goto LAB_0047a57d;
                  }
                  else {
                    std::operator+(&local_240,"$ ",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_200);
                    plVar8 = (long *)std::__cxx11::string::append((char *)&local_240);
                    psVar12 = (size_type *)(plVar8 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar8 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar12) {
                      local_2d0.field_2._M_allocated_capacity = *psVar12;
                      local_2d0.field_2._8_8_ = plVar8[3];
                      local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
                    }
                    else {
                      local_2d0.field_2._M_allocated_capacity = *psVar12;
                      local_2d0._M_dataplus._M_p = (pointer)*plVar8;
                    }
                    local_2d0._M_string_length = plVar8[1];
                    *plVar8 = (long)psVar12;
                    plVar8[1] = 0;
                    *(undefined1 *)(plVar8 + 2) = 0;
                    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
                    sVar11 = strlen(__s);
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_260,__s,__s + sVar11);
                    std::operator+(&local_2f0,&local_2d0,&local_260);
                    puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
                    paVar1 = &local_2b0.Name.field_2;
                    psVar12 = puVar10 + 2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar10 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar12) {
                      local_2b0.Name.field_2._M_allocated_capacity = *psVar12;
                      local_2b0.Name.field_2._8_8_ = puVar10[3];
                      local_2b0.Name._M_dataplus._M_p = (pointer)paVar1;
                    }
                    else {
                      local_2b0.Name.field_2._M_allocated_capacity = *psVar12;
                      local_2b0.Name._M_dataplus._M_p = (pointer)*puVar10;
                    }
                    local_2b0.Name._M_string_length = puVar10[1];
                    *puVar10 = psVar12;
                    puVar10[1] = 0;
                    *(undefined1 *)(puVar10 + 2) = 0;
                    (**connection->_vptr_cmConnection)(connection);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2b0.Name._M_dataplus._M_p != paVar1) {
                      operator_delete(local_2b0.Name._M_dataplus._M_p,
                                      local_2b0.Name.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
                      operator_delete(local_2f0._M_dataplus._M_p,
                                      local_2f0.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_260._M_dataplus._M_p != &local_260.field_2) {
                      operator_delete(local_260._M_dataplus._M_p,
                                      local_260.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
                      operator_delete(local_2d0._M_dataplus._M_p,
                                      local_2d0.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_240._M_dataplus._M_p != &local_240.field_2) {
LAB_0047a57d:
                      operator_delete(local_240._M_dataplus._M_p,
                                      local_240.field_2._M_allocated_capacity + 1);
                    }
                  }
                  local_2f0.field_2._M_allocated_capacity = local_200._16_8_;
                  local_2f0._M_dataplus._M_p = (pointer)local_200._0_8_;
                  if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) goto LAB_0047a59e;
                }
                else {
                  lVar7 = std::__cxx11::string::find((char *)request,0x591f83,0);
                  if ((lVar7 == 0) &&
                     (lVar7 = std::__cxx11::string::find((char)request,0x20), lVar7 != -1)) {
                    std::__cxx11::string::substr((ulong)&local_2b0,(ulong)request);
                    lVar7 = std::__cxx11::string::rfind((char)&local_2b0,0x3a);
                    if ((lVar7 == -1) && ((int)*local_2b0.Name._M_dataplus._M_p - 0x30U < 10)) {
                      iVar5 = std::__cxx11::stoi(&local_2b0.Name,(size_t *)0x0,10);
                      cmPauseContext::CurrentLine((cmListFileContext *)local_200,&local_220);
                      std::__cxx11::string::operator=((string *)&local_2b0,(string *)local_1e0);
                      cmListFileContext::~cmListFileContext((cmListFileContext *)local_200);
                      pcVar2 = (this->super_cmDebugServer).super_cmDebuggerListener.Debugger;
                      (*pcVar2->_vptr_cmDebugger[0xe])(pcVar2,&local_2b0,(long)iVar5);
                      std::operator+(&local_240,"Break at ",&local_2b0.Name);
                      plVar8 = (long *)std::__cxx11::string::append((char *)&local_240);
                      psVar12 = (size_type *)(plVar8 + 2);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*plVar8 ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)psVar12) {
                        local_2d0.field_2._M_allocated_capacity = *psVar12;
                        local_2d0.field_2._8_8_ = plVar8[3];
                        local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
                      }
                      else {
                        local_2d0.field_2._M_allocated_capacity = *psVar12;
                        local_2d0._M_dataplus._M_p = (pointer)*plVar8;
                      }
                      local_2d0._M_string_length = plVar8[1];
                      *plVar8 = (long)psVar12;
                      plVar8[1] = 0;
                      *(undefined1 *)(plVar8 + 2) = 0;
                      std::__cxx11::to_string(&local_260,(long)iVar5);
                      std::operator+(&local_2f0,&local_2d0,&local_260);
                      puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
                      psVar12 = puVar10 + 2;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*puVar10 ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)psVar12) {
                        local_200._16_8_ = *psVar12;
                        local_200._24_4_ = *(undefined4 *)(puVar10 + 3);
                        local_200._28_4_ = *(undefined4 *)((long)puVar10 + 0x1c);
                        local_200._0_8_ =
                             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)(local_200 + 0x10);
                      }
                      else {
                        local_200._16_8_ = *psVar12;
                        local_200._0_8_ =
                             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)*puVar10;
                      }
                      local_200._8_8_ = puVar10[1];
                      *puVar10 = psVar12;
                      puVar10[1] = 0;
                      *(undefined1 *)(puVar10 + 2) = 0;
                      (**connection->_vptr_cmConnection)(connection);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_200._0_8_ !=
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(local_200 + 0x10)) {
                        operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
                        operator_delete(local_2f0._M_dataplus._M_p,
                                        local_2f0.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_260._M_dataplus._M_p != &local_260.field_2) {
                        operator_delete(local_260._M_dataplus._M_p,
                                        local_260.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
                        operator_delete(local_2d0._M_dataplus._M_p,
                                        local_2d0.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_240._M_dataplus._M_p != &local_240.field_2) {
                        operator_delete(local_240._M_dataplus._M_p,
                                        local_240.field_2._M_allocated_capacity + 1);
                      }
                    }
                    goto LAB_0047a1da;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (this->PrintPrompt == true) {
    if (connection == (cmConnection *)0x0) {
      cmDebugServer::AsyncBroadcast(&this->super_cmDebugServer,&PROMPT_abi_cxx11_);
    }
    else {
      (**connection->_vptr_cmConnection)(connection,&PROMPT_abi_cxx11_);
    }
  }
LAB_0047a5d6:
  std::unique_lock<std::recursive_timed_mutex>::~unique_lock(&local_220.Lock);
  return;
}

Assistant:

void cmDebugServerConsole::ProcessRequest(cmConnection* connection,
                                          const std::string& request)
{
  if (request == "b") {
    Debugger.Break();
  } else if (request == "q") {
    exit(0);
  } else if (request.find("watch ") == 0) {
    auto whatToWatch = request.substr(strlen("watch "));
    Debugger.SetWatchpoint(whatToWatch);
    connection->WriteData("Set watchpoint on write '" + whatToWatch + "'\n");
  } else if (request.find("rwatch ") == 0) {
    auto whatToWatch = request.substr(strlen("rwatch "));
    Debugger.SetWatchpoint(whatToWatch, cmWatchpoint::WATCHPOINT_READ);
    connection->WriteData("Set watchpoint on read '" + whatToWatch + "'\n");
  } else if (request.find("awatch ") == 0) {
    auto whatToWatch = request.substr(strlen("awatch "));
    Debugger.SetWatchpoint(whatToWatch, cmWatchpoint::WATCHPOINT_ALL);
    connection->WriteData("Set watchpoint on read/write '" + whatToWatch +
                          "'\n");
  } else if (request.find("info br") == 0) {
    std::stringstream ss;
    auto bps = Debugger.GetBreakpoints();
    for (unsigned i = 0; i < bps.size(); i++) {
      ss << bps[i].Id << " \tbreakpoint \t" << bps[i].File << ":"
         << bps[i].Line << std::endl;
    }
    auto wps = Debugger.GetWatchpoints();
    for (unsigned i = 0; i < wps.size(); i++) {
      ss << wps[i].Id << " \twatchpoint \t" << wps[i].Variable << " \t("
         << cmWatchpoint::GetTypeAsString(wps[i].Type) << ")" << std::endl;
    }
    connection->WriteData(ss.str());
  } else if (request.find("clear") == 0) {
    auto space = request.find(' ');
    if (space == std::string::npos) {
      Debugger.ClearAllBreakpoints();
      Debugger.ClearAllWatchpoints();
      connection->WriteData("Cleared all breakpoints and watchpoints\n");
    } else {
      auto clearWhat = stoi(request.substr(space));

      if (Debugger.ClearBreakpoint(clearWhat)) {
        connection->WriteData("Cleared breakpoint " +
                              std::to_string(clearWhat) + "\n");
      } else if (Debugger.ClearWatchpoint(clearWhat)) {
        connection->WriteData("Cleared watchpoint " +
                              std::to_string(clearWhat) + "\n");
      } else {
        connection->WriteData(
          "Could not find breakpoint or watchpoint with ID of " +
          std::to_string(clearWhat) + "\n");
      }
    }
  } else if (request.find("br") == 0) {
    auto space = request.find(' ');

    // The state doesn't matter if we set an absolute path, so handle that
    // here.
    if (space != std::string::npos) {
      auto bpSpecifier = request.substr(space + 1);
      auto colonPlacement = bpSpecifier.find_last_of(':');
      size_t line = (size_t)-1;

      if (colonPlacement != std::string::npos) {
        line = std::stoi(bpSpecifier.substr(colonPlacement + 1));
        bpSpecifier = bpSpecifier.substr(0, colonPlacement);

        Debugger.SetBreakpoint(bpSpecifier, line);
        connection->WriteData("Break at " + bpSpecifier + ":" +
                              std::to_string(line) + "\n");
      }
    }
  }

  auto ctx = Debugger.PauseContext();
  if (!ctx) {
    return;
  }

  if (request.find("fin") == 0) {
    ctx.StepOut();
  } else if (request == "c") {
    ctx.Continue();
  } else if (request == "n") {
    ctx.Step();
  } else if (request == "s") {
    ctx.StepIn();
  } else if (request.find("l") == 0) {
    auto ctxLines = 10;
    auto fileLines = getFileLines(ctx.CurrentLine().FilePath,
                                  ctx.CurrentLine().Line, ctxLines);
    connection->WriteData(fileLines + "\n");
  } else if (request.find("open") == 0) {
    auto shellCmd =
      request.size() == 4 ? "" : (request.substr(strlen("open ")) + " ");
    system((shellCmd + ctx.CurrentLine().FilePath).c_str());
  } else if (request == "bt") {
    auto currentLine = ctx.CurrentLine();
    connection->WriteData("Paused at " + currentLine.FilePath + ":" +
                          std::to_string(currentLine.Line) + " (" +
                          currentLine.Name + ")\n");

    auto bt = ctx.GetBacktrace();
    std::stringstream ss;
    bt.PrintCallStack(ss);
    connection->WriteData(ss.str());
  } else if (request.find("print ") == 0) {
    auto whatToPrint = request.substr(strlen("print "));
    auto val = ctx.GetMakefile()->GetDefinition(whatToPrint);
    if (val) {
      connection->WriteData("$ " + whatToPrint + " = " + std::string(val) +
                            "\n");
    } else {
      connection->WriteData(whatToPrint + " isn't set.\n");
    }
  } else if (request.find("br") == 0) {
    auto space = request.find(' ');
    if (space != std::string::npos) {
      auto bpSpecifier = request.substr(space + 1);
      auto colonPlacement = bpSpecifier.find_last_of(':');
      size_t line = (size_t)-1;

      if (colonPlacement == std::string::npos &&
          isdigit(*bpSpecifier.c_str())) {
        line = std::stoi(bpSpecifier);
        bpSpecifier = ctx.CurrentLine().FilePath;
        Debugger.SetBreakpoint(bpSpecifier, line);
        connection->WriteData("Break at " + bpSpecifier + ":" +
                              std::to_string(line) + "\n");
      }
    }
  }

  printPrompt(connection);
}